

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O0

nh_bool curses_get_ext_cmd(char *cmd_out,char **namelist,char **desclist,wchar_t listlen)

{
  char **local_48;
  extcmd_hook_args hpa;
  wchar_t i;
  wchar_t listlen_local;
  char **desclist_local;
  char **namelist_local;
  char *cmd_out_local;
  
  local_48 = namelist;
  hpa.namelist = desclist;
  hpa.desclist._0_4_ = listlen;
  hpa._20_4_ = listlen;
  if (settings.extmenu == '\0') {
    hooked_curses_getlin("extended command: (? for help)",cmd_out,ext_cmd_getlin_hook,&local_48);
    mungspaces(cmd_out);
    if ((*cmd_out == '\0') || (*cmd_out == '\x1b')) {
      cmd_out_local._7_1_ = '\0';
    }
    else {
      cmd_out_local._7_1_ = '\x01';
    }
  }
  else {
    hpa.listlen = extcmd_via_menu(namelist,desclist,listlen);
    if (hpa.listlen == L'\xffffffff') {
      cmd_out_local._7_1_ = '\0';
    }
    else {
      strcpy(cmd_out,namelist[hpa.listlen]);
      cmd_out_local._7_1_ = '\x01';
    }
  }
  return cmd_out_local._7_1_;
}

Assistant:

nh_bool curses_get_ext_cmd(char *cmd_out, const char **namelist,
			   const char **desclist, int listlen)
{
	int i;
	struct extcmd_hook_args hpa = {namelist, desclist, listlen};

	if (settings.extmenu) {
	    i = extcmd_via_menu(namelist, desclist, listlen);
	    if (i == -1)
		return FALSE;
	    strcpy(cmd_out, namelist[i]);
	    return TRUE;
	}

	/* maybe a runtime option? */
	hooked_curses_getlin("extended command: (? for help)", cmd_out,
			     ext_cmd_getlin_hook, &hpa);
	mungspaces(cmd_out);
	if (cmd_out[0] == 0 || cmd_out[0] == '\033')
	    return FALSE;
	
	return TRUE;
}